

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cc
# Opt level: O0

int __thiscall Array::subsequence(Array *this,Array_S *ar)

{
  int iVar1;
  element_type *peVar2;
  element_type *peVar3;
  reference pvVar4;
  int local_8c;
  undefined1 local_88 [4];
  int start;
  shared_ptr<Array> local_68;
  int local_54;
  undefined1 local_50 [4];
  int retval;
  Array_S ar2;
  Array_S ar1;
  int sz2;
  int sz1;
  int j;
  int i;
  Array_S *ar_local;
  Array *this_local;
  
  std::shared_ptr<Array>::shared_ptr
            ((shared_ptr<Array> *)
             &ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::shared_ptr<Array>::shared_ptr((shared_ptr<Array> *)local_50);
  iVar1 = this->theSize;
  peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ar);
  if (peVar2->theSize < iVar1) {
    peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ar);
    ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         peVar2->theSize;
    ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         this->theSize;
    std::shared_ptr<Array>::operator=
              ((shared_ptr<Array> *)
               &ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount,ar);
    std::shared_ptr<Array>::shared_ptr<Array,void>((shared_ptr<Array> *)local_88,this);
    std::shared_ptr<Array>::operator=((shared_ptr<Array> *)local_50,(shared_ptr<Array> *)local_88);
    std::shared_ptr<Array>::~shared_ptr((shared_ptr<Array> *)local_88);
    local_54 = -1;
  }
  else {
    ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
         this->theSize;
    peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)ar);
    ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ =
         peVar2->theSize;
    std::shared_ptr<Array>::shared_ptr<Array,void>(&local_68,this);
    std::shared_ptr<Array>::operator=
              ((shared_ptr<Array> *)
               &ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_68);
    std::shared_ptr<Array>::~shared_ptr(&local_68);
    std::shared_ptr<Array>::operator=((shared_ptr<Array> *)local_50,ar);
    local_54 = 1;
  }
  local_8c = 0;
  sz1 = 0;
  do {
    if (ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ <= sz1) {
      this_local._4_4_ = local_54;
LAB_00120c8b:
      std::shared_ptr<Array>::~shared_ptr((shared_ptr<Array> *)local_50);
      std::shared_ptr<Array>::~shared_ptr
                ((shared_ptr<Array> *)
                 &ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      return this_local._4_4_;
    }
    for (sz2 = local_8c;
        sz2 < (int)ar1.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
        sz2 = sz2 + 1) {
      peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          &ar2.super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      peVar3 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)peVar2);
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(peVar3,(long)sz1);
      iVar1 = *pvVar4;
      peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_50);
      peVar3 = std::
               __shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)peVar2);
      pvVar4 = std::vector<int,_std::allocator<int>_>::at(peVar3,(long)sz2);
      if (iVar1 == *pvVar4) {
        local_8c = sz2 + 1;
        break;
      }
    }
    peVar2 = std::__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Array,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_50);
    if (peVar2->theSize <= sz2) {
      this_local._4_4_ = 0;
      goto LAB_00120c8b;
    }
    sz1 = sz1 + 1;
  } while( true );
}

Assistant:

int Array::subsequence(Array_S ar) {
    int i, j;
    int sz1, sz2;
    Array_S ar1, ar2;
    int retval;

    if (theSize <= ar->theSize) {
        sz1 = theSize;
        sz2 = ar->theSize;
        ar1 = shared_ptr<Array>(this);
        ar2 = ar;
        retval = 1;
    } else {
        sz1 = ar->theSize;
        sz2 = theSize;
        ar1 = ar;
        ar2 = shared_ptr<Array>(this);
        retval = -1;
    }
    int start = 0;
    for (i = 0; i < sz1; i++) {
        for (j = start; j < sz2; j++) {
            if (ar1->theArray->at(i) == ar2->theArray->at(j)) {
                start = j + 1;
                break;
            }
        }
        if (j >= ar2->theSize) return 0;
    }
    return retval;
}